

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O1

unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> __thiscall
spvtools::MakeUnique<spvtools::opt::Loop,spvtools::opt::Loop&>(spvtools *this,Loop *args)

{
  BasicBlock *pBVar1;
  BasicBlock *pBVar2;
  BasicBlock *pBVar3;
  BasicBlock *pBVar4;
  BasicBlock *pBVar5;
  size_t sVar6;
  undefined8 *puVar7;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_20;
  
  puVar7 = (undefined8 *)operator_new(0x90);
  pBVar1 = args->loop_header_;
  pBVar2 = args->loop_continue_;
  pBVar3 = args->loop_merge_;
  pBVar4 = args->loop_preheader_;
  pBVar5 = args->loop_latch_;
  *puVar7 = args->context_;
  puVar7[1] = pBVar1;
  puVar7[2] = pBVar2;
  puVar7[3] = pBVar3;
  puVar7[4] = pBVar4;
  puVar7[5] = pBVar5;
  puVar7[6] = args->parent_;
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::vector
            ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)(puVar7 + 7),
             &args->nested_loops_);
  local_20._M_h = (__hashtable_alloc *)(puVar7 + 10);
  puVar7[10] = 0;
  puVar7[0xb] = (args->loop_basic_blocks_)._M_h._M_bucket_count;
  puVar7[0xc] = 0;
  puVar7[0xd] = (args->loop_basic_blocks_)._M_h._M_element_count;
  sVar6 = (args->loop_basic_blocks_)._M_h._M_rehash_policy._M_next_resize;
  puVar7[0xe] = *(undefined8 *)&(args->loop_basic_blocks_)._M_h._M_rehash_policy;
  puVar7[0xf] = sVar6;
  puVar7[0x10] = 0;
  std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_20._M_h,&(args->loop_basic_blocks_)._M_h,&local_20);
  *(bool *)(puVar7 + 0x11) = args->loop_is_marked_for_removal_;
  *(undefined8 **)this = puVar7;
  return (__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>
         )(__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}